

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O3

istream * operator>>(istream *is,MTRand *mtrand)

{
  int iVar1;
  
  iVar1 = 0;
  do {
    std::istream::_M_extract<unsigned_long>((ulong *)is);
    iVar1 = iVar1 + 8;
  } while (iVar1 != 0x1380);
  std::istream::operator>>((istream *)is,&mtrand->left);
  mtrand->pNext = (uint32 *)((long)mtrand + (0x270 - (long)mtrand->left) * 8);
  return is;
}

Assistant:

std::istream &operator>>(std::istream &is, MTRand &mtrand) {
  MTRand::uint32 *s = mtrand.state;
  int i = mtrand.N;
  for (; i--; is >> *s++) {
  }
  is >> mtrand.left;
  mtrand.pNext = &mtrand.state[mtrand.N - mtrand.left];
  return is;
}